

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svc_layercontext.c
# Opt level: O2

void av1_svc_set_last_source
               (AV1_COMP *cpi,EncodeFrameInput *frame_input,YV12_BUFFER_CONFIG *prev_source)

{
  int iVar1;
  uint uVar2;
  AV1_PRIMARY *pAVar3;
  YV12_BUFFER_CONFIG *pYVar4;
  
  frame_input->last_source = prev_source;
  pAVar3 = cpi->ppi;
  if (((pAVar3->use_svc != 0) || ((cpi->rc).prev_frame_is_dropped == 0)) ||
     ((cpi->rc).frame_number_encoded == 0)) {
    iVar1 = (cpi->svc).spatial_layer_id;
    if (iVar1 != 0) {
      if (iVar1 < 1) {
        return;
      }
      pYVar4 = (YV12_BUFFER_CONFIG *)0x0;
      if ((cpi->svc).current_superframe != 0) {
        pYVar4 = &(cpi->svc).source_last_TL0;
      }
      goto LAB_00205a4c;
    }
    uVar2 = (cpi->svc).current_superframe;
    if (uVar2 == 0) {
      return;
    }
    if (((((cpi->svc).layer_context)->rc).prev_frame_is_dropped == 0) &&
       (uVar2 - 1 <= (pAVar3->rtc_ref).buffer_time_index[(pAVar3->rtc_ref).ref_idx[0]])) {
      return;
    }
  }
  pYVar4 = &(cpi->svc).source_last_TL0;
LAB_00205a4c:
  frame_input->last_source = pYVar4;
  return;
}

Assistant:

void av1_svc_set_last_source(AV1_COMP *const cpi, EncodeFrameInput *frame_input,
                             YV12_BUFFER_CONFIG *prev_source) {
  frame_input->last_source = prev_source != NULL ? prev_source : NULL;
  if (!cpi->ppi->use_svc && cpi->rc.prev_frame_is_dropped &&
      cpi->rc.frame_number_encoded > 0) {
    frame_input->last_source = &cpi->svc.source_last_TL0;
  } else {
    RTC_REF *const rtc_ref = &cpi->ppi->rtc_ref;
    if (cpi->svc.spatial_layer_id == 0) {
      // For base spatial layer: if the LAST reference (index 0) is not
      // the previous (super)frame set the last_source to the source
      // corresponding to the last TL0, otherwise keep it at prev_source.
      // Always use source_last_TL0 if previous base TL0 was dropped.
      if (cpi->svc.current_superframe > 0) {
        const int buffslot_last = rtc_ref->ref_idx[0];
        // Check if previous frame was dropped on base TL0 layer.
        const int layer =
            LAYER_IDS_TO_IDX(0, 0, cpi->svc.number_temporal_layers);
        LAYER_CONTEXT *lc = &cpi->svc.layer_context[layer];
        RATE_CONTROL *lrc = &lc->rc;
        if (lrc->prev_frame_is_dropped ||
            rtc_ref->buffer_time_index[buffslot_last] <
                cpi->svc.current_superframe - 1) {
          frame_input->last_source = &cpi->svc.source_last_TL0;
        }
      }
    } else if (cpi->svc.spatial_layer_id > 0) {
      // For spatial enhancement layers: the previous source (prev_source)
      // corresponds to the lower spatial layer (which is the same source so
      // we can't use that), so always set the last_source to the source of the
      // last TL0.
      if (cpi->svc.current_superframe > 0)
        frame_input->last_source = &cpi->svc.source_last_TL0;
      else
        frame_input->last_source = NULL;
    }
  }
}